

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O3

uint32 __thiscall
Js::ByteCodeBufferBuilder::PrependStruct<Js::AsmJsModuleMemory>
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,LPCWSTR clue,
          AsmJsModuleMemory *value)

{
  ImmutableList<Js::BufferBuilder_*> *pIVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  BufferBuilder *pBVar5;
  ImmutableList<Js::BufferBuilder_*> *pIVar6;
  
  pBVar5 = (BufferBuilder *)new<Memory::ArenaAllocator>(0x38,this->alloc,0x364470);
  pBVar5->clue = clue;
  pBVar5->offset = 0xffffffff;
  pBVar5->_vptr_BufferBuilder = (_func_int **)&PTR_FixOffset_014dd9f8;
  uVar2 = *(undefined8 *)&value->mDoubleOffset;
  uVar3 = *(undefined8 *)&value->mFFIOffset;
  uVar4 = *(undefined8 *)&value->mIntOffset;
  *(undefined8 *)&pBVar5->field_0x14 = *(undefined8 *)value;
  *(undefined8 *)((long)&pBVar5[1]._vptr_BufferBuilder + 4) = uVar2;
  *(undefined8 *)((long)&pBVar5[1].clue + 4) = uVar3;
  *(undefined8 *)&pBVar5[1].field_0x14 = uVar4;
  *(Type *)((long)&pBVar5[2]._vptr_BufferBuilder + 4) = value->mMemorySize;
  pBVar5->_vptr_BufferBuilder = (_func_int **)&PTR_FixOffset_014dd9d8;
  pIVar1 = builder->list;
  pIVar6 = (ImmutableList<Js::BufferBuilder_*> *)
           new<Memory::ArenaAllocator>(0x10,this->alloc,0x364470);
  pIVar6->value = pBVar5;
  pIVar6->next = pIVar1;
  builder->list = pIVar6;
  return 0x24;
}

Assistant:

uint32 PrependStruct(BufferBuilderList & builder, LPCWSTR clue, TStructType * value)
    {
        auto entry = Anew(alloc, ConstantSizedBufferBuilderOf<TStructType>, clue, *value);
        builder.list = builder.list->Prepend(entry, alloc);

        return sizeof(serialization_alignment TStructType);
    }